

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall rengine::Node::append(Node *this,Node *child)

{
  uint __line;
  bool bVar1;
  Node *pNVar2;
  Node **ppNVar3;
  Node *pNVar4;
  char *__assertion;
  
  if (child == (Node *)0x0) {
    __assertion = "child";
    __line = 0x62;
  }
  else {
    bVar1 = hasChild(this,child);
    if (bVar1) {
      __assertion = "!hasChild(child)";
      __line = 99;
    }
    else if (child->m_parent == (Node *)0x0) {
      if (child->m_next == (Node *)0x0) {
        if (child->m_prev == (Node *)0x0) {
          pNVar2 = this->m_child;
          if (pNVar2 == (Node *)0x0) {
            ppNVar3 = &this->m_child;
            pNVar2 = child;
            pNVar4 = child;
          }
          else {
            ppNVar3 = &pNVar2->m_prev;
            pNVar4 = pNVar2->m_prev;
            pNVar4->m_next = child;
          }
          child->m_prev = pNVar4;
          *ppNVar3 = child;
          child->m_next = pNVar2;
          setParent(child,this);
          return;
        }
        __assertion = "child->m_prev == 0";
        __line = 0x66;
      }
      else {
        __assertion = "child->m_next == 0";
        __line = 0x65;
      }
    }
    else {
      __assertion = "child->m_parent == 0";
      __line = 100;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                ,__line,"void rengine::Node::append(Node *)");
}

Assistant:

void append(Node *child) {
        assert(child);
        assert(!hasChild(child));
        assert(child->m_parent == 0);
        assert(child->m_next == 0);
        assert(child->m_prev == 0);

        if (!m_child) {
            child->m_next = child;
            child->m_prev = child;
            m_child = child;
        } else {
            m_child->m_prev->m_next = child;
            child->m_prev = m_child->m_prev;
            m_child->m_prev = child;
            child->m_next = m_child;
        }
        child->setParent(this);
    }